

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_xor(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  uint32_t uVar1;
  uint32_t uVar2;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rS(ctx->opcode);
  uVar2 = rB(ctx->opcode);
  if (uVar1 == uVar2) {
    uVar1 = rA(ctx->opcode);
    tcg_gen_movi_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar1],0);
  }
  else {
    uVar1 = rA(ctx->opcode);
    ret = cpu_gpr[uVar1];
    uVar1 = rS(ctx->opcode);
    arg1 = cpu_gpr[uVar1];
    uVar1 = rB(ctx->opcode);
    tcg_gen_xor_i64_ppc64(tcg_ctx_00,ret,arg1,cpu_gpr[uVar1]);
  }
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    uVar1 = rA(ctx->opcode);
    gen_set_Rc0(ctx,cpu_gpr[uVar1]);
  }
  return;
}

Assistant:

static void gen_xor(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    /* Optimisation for "set to zero" case */
    if (rS(ctx->opcode) != rB(ctx->opcode)) {
        tcg_gen_xor_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rS(ctx->opcode)],
                       cpu_gpr[rB(ctx->opcode)]);
    } else {
        tcg_gen_movi_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], 0);
    }
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}